

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_ru_u_access<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true,false>>>
               (void)

{
  uint uVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  pointer pvVar13;
  node_ptr next;
  Column_zp_settings *this;
  _Base_ptr p_Var14;
  _Hash_node_base *p_Var15;
  ulong uVar16;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  uColumns;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  orderedBoundaries;
  Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>
  m;
  shared_count sStack_310;
  char *local_308;
  _Base_ptr local_300;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  local_2f8;
  _Hash_node_base *local_2d8;
  _Rb_tree_color _Stack_2d0;
  undefined4 uStack_2cc;
  _Base_ptr local_2c8;
  _Base_ptr local_2c0;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  local_2a8;
  undefined1 local_290 [176];
  __buckets_ptr local_1e0;
  ulong local_1d8;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true,false>>>>
            ();
  this = (Column_zp_settings *)operator_new(0x58);
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>
  ::Column_zp_settings::Column_zp_settings(this,5);
  local_290._0_8_ = this;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true,false>>>
  ::
  RU_matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true,false>>>
              *)(local_290 + 8),&local_2a8,this);
  local_2f8.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var14 = (_Base_ptr)operator_new(0xa8);
  local_2f8.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var14;
  local_2f8.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&p_Var14[5]._M_parent;
  memset(p_Var14,0,0xa8);
  local_2d8 = (_Hash_node_base *)0x100000000;
  local_2f8.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&p_Var14[5]._M_parent;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)p_Var14,&local_2d8);
  local_2d8 = (_Hash_node_base *)0x100000001;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)((long)local_2f8.
                       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 0x18),&local_2d8);
  local_2d8 = (_Hash_node_base *)0x100000002;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&((_Base_ptr)
                 ((long)local_2f8.
                        super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 0x20))->_M_left,&local_2d8);
  local_2d8 = (_Hash_node_base *)0x100000003;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&((_Base_ptr)
                 ((long)local_2f8.
                        super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 0x40))->_M_parent,&local_2d8);
  local_2d8 = (_Hash_node_base *)0x100000004;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)((long)local_2f8.
                       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 0x60),&local_2d8);
  local_2d8 = (_Hash_node_base *)0x400000003;
  _Stack_2d0 = 4;
  uStack_2cc = 4;
  local_2c8 = (_Base_ptr)0x100000005;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&((_Base_ptr)
                 ((long)local_2f8.
                        super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 0x60))->_M_right,&local_2d8);
  local_2d8 = (_Hash_node_base *)0x100000006;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&((_Base_ptr)
                 ((long)local_2f8.
                        super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 0x80))->_M_left,&local_2d8);
  pvVar13 = local_2f8.
            super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_2f8.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2f8.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar16 = 0;
    p_Var14 = (_Base_ptr)
              local_2f8.
              super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (local_1e0[uVar16 % local_1d8] == (__node_base_ptr)0x0) {
LAB_001b41cb:
        std::__throw_out_of_range("_Map_base::at");
      }
      p_Var2 = local_1e0[uVar16 % local_1d8]->_M_nxt;
      uVar1 = *(uint *)&p_Var2[1]._M_nxt;
      while ((uint)uVar16 != uVar1) {
        p_Var2 = p_Var2->_M_nxt;
        if ((p_Var2 == (_Hash_node_base *)0x0) ||
           (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_1d8 != uVar16 % local_1d8))
        goto LAB_001b41cb;
      }
      get_column_content_via_iterators<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true,false>>>>
                ((column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>_>
                  *)&local_2d8,
                 (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
                  *)(p_Var2 + 2));
      test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true,false>>>>
                ((witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>_>
                  *)p_Var14,
                 (column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>_>
                  *)&local_2d8);
      uVar16 = (ulong)((uint)uVar16 + 1);
      std::
      _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::~_Rb_tree((_Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)&local_2d8);
      p_Var14 = (_Base_ptr)&p_Var14->_M_right;
    } while (p_Var14 != (_Base_ptr)pvVar13);
  }
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x29f);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_1d8;
  uVar16 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(5)) % auVar5,0);
  if (local_1e0[uVar16 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var2 = local_1e0[uVar16 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 5) {
        p_Var15 = p_Var2 + 7;
        goto LAB_001b3a73;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_1d8 == uVar16));
  }
  std::__throw_out_of_range("_Map_base::at");
  while (*(int *)&p_Var15[2]._M_nxt != 3) {
LAB_001b3a73:
    p_Var15 = p_Var15->_M_nxt;
    if (p_Var15 == p_Var2 + 7) break;
  }
  sStack_310.pi_ = (sp_counted_base *)0x0;
  local_308 = "!m.is_zero_entry(5, 3, false)";
  local_300 = (_Base_ptr)0x1cadfb;
  _Stack_2d0 = _Stack_2d0 & 0xffffff00;
  local_2d8 = (_Hash_node_base *)&PTR__lazy_ostream_001fb150;
  local_2c8 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_58 = "";
  local_2c0 = (_Base_ptr)&local_308;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_310);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x2a0);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_1d8;
  uVar16 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar6,0);
  if (local_1e0[uVar16 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var2 = local_1e0[uVar16 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 4) {
        sStack_310.pi_ = (sp_counted_base *)0x0;
        local_308 = "!m.is_zero_column(4, false)";
        local_300 = (_Base_ptr)0x1cae17;
        _Stack_2d0 = _Stack_2d0 & 0xffffff00;
        local_2d8 = (_Hash_node_base *)&PTR__lazy_ostream_001fb150;
        local_2c8 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_90 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_88 = "";
        local_2c0 = (_Base_ptr)&local_308;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_310);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = local_1d8;
        uVar16 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(5)) % auVar7,0);
        if (local_1e0[uVar16 & 0xffffffff] == (__node_base_ptr)0x0) goto LAB_001b41d7;
        p_Var2 = local_1e0[uVar16 & 0xffffffff]->_M_nxt;
        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
        goto joined_r0x001b3c59;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_1d8 == uVar16));
  }
  std::__throw_out_of_range("_Map_base::at");
  while (*(int *)&p_Var15[2]._M_nxt != 3) {
LAB_001b3c8b:
    p_Var15 = p_Var15->_M_nxt;
    if (p_Var15 == p_Var2 + 7) goto LAB_001b3cbe;
  }
  p_Var3 = p_Var15->_M_nxt;
  p_Var4 = p_Var15[1]._M_nxt;
  p_Var4->_M_nxt = p_Var3;
  p_Var3[1]._M_nxt = p_Var4;
  p_Var15->_M_nxt = (_Hash_node_base *)0x0;
  p_Var15[1]._M_nxt = (_Hash_node_base *)0x0;
  local_2d8 = (_Hash_node_base *)(p_Var2 + 2);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
  ::Delete_disposer::operator()((Delete_disposer *)&local_2d8,(Entry *)(p_Var15 + -1));
LAB_001b3cbe:
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x2a2);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_1d8;
  uVar16 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(5)) % auVar8,0);
  if (local_1e0[uVar16 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var2 = local_1e0[uVar16 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 5) {
        p_Var15 = p_Var2 + 7;
        goto LAB_001b3d4e;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_1d8 == uVar16));
  }
  std::__throw_out_of_range("_Map_base::at");
  while (*(int *)&p_Var15[2]._M_nxt != 3) {
LAB_001b3d4e:
    p_Var15 = p_Var15->_M_nxt;
    if (p_Var15 == p_Var2 + 7) break;
  }
  sStack_310.pi_ = (sp_counted_base *)0x0;
  local_308 = "m.is_zero_entry(5, 3, false)";
  local_300 = (_Base_ptr)0x1cadfb;
  _Stack_2d0 = _Stack_2d0 & 0xffffff00;
  local_2d8 = (_Hash_node_base *)&PTR__lazy_ostream_001fb150;
  local_2c8 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_b8 = "";
  local_2c0 = (_Base_ptr)&local_308;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_310);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x2a3);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_1d8;
  uVar16 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar9,0);
  if (local_1e0[uVar16 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var2 = local_1e0[uVar16 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 4) {
        sStack_310.pi_ = (sp_counted_base *)0x0;
        local_308 = "!m.is_zero_column(4, false)";
        local_300 = (_Base_ptr)0x1cae17;
        _Stack_2d0 = _Stack_2d0 & 0xffffff00;
        local_2d8 = (_Hash_node_base *)&PTR__lazy_ostream_001fb150;
        local_2c8 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_f0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_e8 = "";
        local_2c0 = (_Base_ptr)&local_308;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_310);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = local_1d8;
        uVar16 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar10,0);
        if (local_1e0[uVar16 & 0xffffffff] == (__node_base_ptr)0x0) goto LAB_001b41d7;
        p_Var2 = local_1e0[uVar16 & 0xffffffff]->_M_nxt;
        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
        goto joined_r0x001b3f30;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_1d8 == uVar16));
  }
  std::__throw_out_of_range("_Map_base::at");
  while ((p_Var2 = p_Var2->_M_nxt, p_Var2 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_1d8 == uVar16))) {
joined_r0x001b3c59:
    if (uVar1 == 5) {
      p_Var15 = p_Var2 + 7;
      goto LAB_001b3c8b;
    }
  }
LAB_001b41d7:
  std::__throw_out_of_range("_Map_base::at");
joined_r0x001b3f30:
  if (uVar1 != 4) {
    p_Var2 = p_Var2->_M_nxt;
    if ((p_Var2 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_1d8 != uVar16)) goto LAB_001b41d7;
    goto joined_r0x001b3f30;
  }
  boost::intrusive::
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true,false>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true,false>>::Matrix_column_tag,1u>,unsigned_long,false,void>
  ::
  clear_and_dispose<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true,false>>>::Delete_disposer>
            ((list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true,false>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true,false>>::Matrix_column_tag,1u>,unsigned_long,false,void>
              *)(p_Var2 + 7),
             (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
              *)(p_Var2 + 2));
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x2a5);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_1d8;
  uVar16 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(5)) % auVar11,0);
  if (local_1e0[uVar16 & 0xffffffff] == (__node_base_ptr)0x0) goto LAB_001b4213;
  p_Var2 = local_1e0[uVar16 & 0xffffffff]->_M_nxt;
  uVar1 = *(uint *)&p_Var2[1]._M_nxt;
  while (uVar1 != 5) {
    p_Var2 = p_Var2->_M_nxt;
    if ((p_Var2 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_1d8 != uVar16)) {
LAB_001b4213:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  p_Var15 = p_Var2 + 7;
  do {
    p_Var15 = p_Var15->_M_nxt;
    if (p_Var15 == p_Var2 + 7) break;
  } while (*(int *)&p_Var15[2]._M_nxt != 3);
  sStack_310.pi_ = (sp_counted_base *)0x0;
  local_308 = "m.is_zero_entry(5, 3, false)";
  local_300 = (_Base_ptr)0x1cadfb;
  _Stack_2d0 = _Stack_2d0 & 0xffffff00;
  local_2d8 = (_Hash_node_base *)&PTR__lazy_ostream_001fb150;
  local_2c8 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_118 = "";
  local_2c0 = (_Base_ptr)&local_308;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_310);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x2a6);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_1d8;
  uVar16 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar12,0);
  if (local_1e0[uVar16 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var2 = local_1e0[uVar16 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 4) {
        sStack_310.pi_ = (sp_counted_base *)0x0;
        local_308 = "m.is_zero_column(4, false)";
        local_300 = (_Base_ptr)0x1cae17;
        _Stack_2d0 = _Stack_2d0 & 0xffffff00;
        local_2d8 = (_Hash_node_base *)&PTR__lazy_ostream_001fb150;
        local_2c8 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_150 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_148 = "";
        local_2c0 = (_Base_ptr)&local_308;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_310);
        std::
        vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
        ::~vector(&local_2f8);
        Gudhi::persistence_matrix::
        Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>
        ::~Matrix((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>
                   *)local_290);
        std::
        vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
        ::~vector(&local_2a8);
        return;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_1d8 == uVar16));
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

void test_ru_u_access() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(orderedBoundaries, 5);

  std::vector<witness_content<typename Matrix::Column> > uColumns(7);
  if constexpr (Matrix::Option_list::is_z2) {
    uColumns[0] = {0};
    uColumns[1] = {1};
    uColumns[2] = {2};
    uColumns[3] = {3, 5};
    uColumns[4] = {4, 5};
    uColumns[5] = {5};
    uColumns[6] = {6};
  } else {
    uColumns[0] = {{0, 1}};
    uColumns[1] = {{1, 1}};
    uColumns[2] = {{2, 1}};
    uColumns[3] = {{3, 1}};
    uColumns[4] = {{4, 1}};
    uColumns[5] = {{3, 4}, {4, 4}, {5, 1}};
    uColumns[6] = {{6, 1}};
  }

  unsigned int i = 0;
  for (auto& c : uColumns) {
    const auto& col = m.get_column(i++, false);  // to force the const version
    test_column_equality<typename Matrix::Column>(c, get_column_content_via_iterators(col));
  }

  if constexpr (Matrix::Option_list::is_z2) {
    BOOST_CHECK(!m.is_zero_entry(3, 5, false));
    BOOST_CHECK(!m.is_zero_column(4, false));
    m.zero_entry(3, 5, false);
    BOOST_CHECK(m.is_zero_entry(3, 5, false));
    BOOST_CHECK(!m.is_zero_column(4, false));
    m.zero_column(4, false);
    BOOST_CHECK(m.is_zero_entry(3, 5, false));
    BOOST_CHECK(m.is_zero_column(4, false));
  } else {
    BOOST_CHECK(!m.is_zero_entry(5, 3, false));
    BOOST_CHECK(!m.is_zero_column(4, false));
    m.zero_entry(5, 3, false);
    BOOST_CHECK(m.is_zero_entry(5, 3, false));
    BOOST_CHECK(!m.is_zero_column(4, false));
    m.zero_column(4, false);
    BOOST_CHECK(m.is_zero_entry(5, 3, false));
    BOOST_CHECK(m.is_zero_column(4, false));
  }
}